

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

mat4 * dja::mat4::homogeneous::rotation(mat4 *__return_storage_ptr__,quaternion *q)

{
  undefined8 local_38;
  float_t local_30;
  undefined8 local_2c;
  float_t local_24;
  undefined8 local_20;
  float_t local_18;
  
  mat3::rotation(q);
  __return_storage_ptr__->m[0].x = (float_t)(undefined4)local_38;
  __return_storage_ptr__->m[0].y = (float_t)local_38._4_4_;
  __return_storage_ptr__->m[0].z = local_30;
  __return_storage_ptr__->m[0].w = 0.0;
  __return_storage_ptr__->m[1].x = (float_t)(undefined4)local_2c;
  __return_storage_ptr__->m[1].y = (float_t)local_2c._4_4_;
  __return_storage_ptr__->m[1].z = local_24;
  __return_storage_ptr__->m[1].w = 0.0;
  __return_storage_ptr__->m[2].x = (float_t)(undefined4)local_20;
  __return_storage_ptr__->m[2].y = (float_t)local_20._4_4_;
  __return_storage_ptr__->m[2].z = local_18;
  *(undefined8 *)&__return_storage_ptr__->m[2].w = 0;
  __return_storage_ptr__->m[3].y = 0.0;
  __return_storage_ptr__->m[3].z = 0.0;
  __return_storage_ptr__->m[3].w = 1.0;
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4::homogeneous::rotation(const quaternion& q)
{
    return mat4::homogeneous::from_mat3(mat3::rotation(q));
}